

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

void __thiscall FirewirePort::StopCycleStartPacket(FirewirePort *this)

{
  raw1394handle_t prVar1;
  undefined2 uVar2;
  ostream *poVar3;
  __uint32_t local_18;
  int local_14;
  quadlet_t data_stop_cmc;
  int rc;
  FirewirePort *this_local;
  
  local_14 = 0;
  _data_stop_cmc = this;
  local_18 = __bswap_32(0x100);
  prVar1 = this->handle;
  uVar2 = raw1394_get_local_id(this->handle);
  local_14 = raw1394_write(prVar1,uVar2,0xfffff0000000,4,&local_18);
  if (local_14 == 0) {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::Init: successfully disabled cycle start packet");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((this->super_BasePort).outStr,
                             "FirewirePort::Init: error, can NOT disable cycle start packet");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void FirewirePort::StopCycleStartPacket(void)
{
    // IMPORTANT: Disable Cycle Start Packet, no isochronous
    int rc = 0;  // return code
    quadlet_t data_stop_cmc = bswap_32(0x100);
    rc = raw1394_write(handle,
                       raw1394_get_local_id(handle),
                       CSR_REGISTER_BASE + CSR_STATE_CLEAR,
                       4,
                       &data_stop_cmc);
    if (rc) {
        outStr << "FirewirePort::Init: error, can NOT disable cycle start packet" << std::endl;
    } else {
        outStr << "FirewirePort::Init: successfully disabled cycle start packet" << std::endl;
    }
}